

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringOld
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  ostream *poVar11;
  undefined7 in_register_00000009;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar12;
  _func_int **string;
  string input;
  cmCommandArgumentParserHelper parser;
  undefined1 auStack_2e8 [8];
  string *local_2e0;
  string local_2d8;
  cmMakefile *local_2b8;
  undefined4 local_2ac;
  string local_2a8;
  RegularExpression *local_288;
  undefined1 local_280 [16];
  _func_int *local_270 [12];
  ios_base local_210 [264];
  undefined1 local_108 [152];
  _Alloc_hider local_70;
  bool local_36;
  bool local_35;
  bool local_34;
  bool local_33;
  
  local_2ac = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  local_2e0 = source;
  local_2b8 = this;
  lVar8 = std::__cxx11::string::find_first_of((char *)source,0x5bd2c6,0);
  psVar4 = local_2e0;
  if (lVar8 == -1) {
    return LOG;
  }
  if (atOnly) {
    local_280._0_8_ = local_270;
    pcVar1 = (local_2e0->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_280,pcVar1,pcVar1 + local_2e0->_M_string_length);
    std::__cxx11::string::_M_replace((ulong)psVar4,0,(char *)psVar4->_M_string_length,0x5f2b3e);
    local_288 = &local_2b8->cmAtVarRegex;
    string = (_func_int **)local_280._0_8_;
    while (bVar5 = cmsys::RegularExpression::find(local_288,(char *)string), bVar5) {
      pcVar9 = (local_2b8->cmAtVarRegex).searchstring;
      pcVar2 = (local_2b8->cmAtVarRegex).startp[0];
      pcVar3 = (local_2b8->cmAtVarRegex).endp[0];
      std::__cxx11::string::append((char *)local_2e0,(ulong)string);
      lVar8 = (long)pcVar3 - (long)pcVar9;
      local_108._0_8_ = local_108 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,(char *)((long)string + (long)(pcVar2 + (1 - (long)pcVar9))),
                 (long)string + lVar8 + -1);
      pcVar9 = GetDefinition(local_2b8,(string *)local_108);
      if (pcVar9 != (char *)0x0) {
        if ((char)local_2ac == '\0') {
          std::__cxx11::string::append((char *)local_2e0);
        }
        else {
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          sVar10 = strlen(pcVar9);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a8,pcVar9,pcVar9 + sVar10);
          cmSystemTools::EscapeQuotes(&local_2d8,&local_2a8);
          std::__cxx11::string::_M_append((char *)local_2e0,(ulong)local_2d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      string = (_func_int **)((long)string + lVar8);
    }
    std::__cxx11::string::append((char *)local_2e0);
    if ((_func_int **)local_280._0_8_ == local_270) {
      return LOG;
    }
    operator_delete((void *)local_280._0_8_,(ulong)(local_270[0] + 1));
    return LOG;
  }
  cmCommandArgumentParserHelper::cmCommandArgumentParserHelper
            ((cmCommandArgumentParserHelper *)local_108);
  cmCommandArgumentParserHelper::SetMakefile((cmCommandArgumentParserHelper *)local_108,local_2b8);
  cmCommandArgumentParserHelper::SetLineFile
            ((cmCommandArgumentParserHelper *)local_108,line,filename);
  local_36 = SUB41(local_2ac,0);
  local_34 = replaceAt;
  local_33 = removeEmpty;
  local_35 = noEscapes;
  iVar6 = cmCommandArgumentParserHelper::ParseString
                    ((cmCommandArgumentParserHelper *)local_108,(local_2e0->_M_dataplus)._M_p,0);
  if ((iVar6 != 0) && (*local_70._M_p == '\0')) {
    MVar12 = LOG;
    std::__cxx11::string::_M_assign((string *)local_2e0);
    goto LAB_002e86e1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"Syntax error in cmake code ",0x1b);
  if (0 < line && filename != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"at\n",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"  ",2);
    sVar10 = strlen(filename);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,filename,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,":",1);
    poVar11 = std::ostream::_M_insert<long>((long)local_280);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_280,"when parsing string\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"  ",2);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,(local_2e0->_M_dataplus)._M_p,
                       local_2e0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  if (local_70._M_p == (char *)0x0) {
    std::ios::clear((int)(auStack_2e8 + (long)*(_func_int **)(local_280._0_8_ + -0x18)) + 0x68);
  }
  else {
    sVar10 = strlen(local_70._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,local_70._M_p,sVar10);
  }
  MVar12 = FATAL_ERROR;
  if (iVar6 == 0) {
    PVar7 = cmStateSnapshot::GetPolicy(&local_2b8->StateSnapshot,CMP0010);
    if (PVar7 - REQUIRED_IF_USED < 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_2d8,(cmPolicies *)0xa,id_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_280,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (PVar7 != OLD) {
        if (PVar7 != WARN) goto LAB_002e85e4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2d8,(cmPolicies *)0xa,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
      }
      MVar12 = AUTHOR_WARNING;
    }
  }
LAB_002e85e4:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
  std::ios_base::~ios_base(local_210);
LAB_002e86e1:
  cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper
            ((cmCommandArgumentParserHelper *)local_108);
  return MVar12;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringOld(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // Fast path strings without any special characters.
  if (source.find_first_of("$@\\") == std::string::npos) {
    return cmake::LOG;
  }

  // Special-case the @ONLY mode.
  if (atOnly) {
    // Store an original copy of the input.
    std::string input = source;

    // Start with empty output.
    source = "";

    // Look for one @VAR@ at a time.
    const char* in = input.c_str();
    while (this->cmAtVarRegex.find(in)) {
      // Get the range of the string to replace.
      const char* first = in + this->cmAtVarRegex.start();
      const char* last = in + this->cmAtVarRegex.end();

      // Store the unchanged part of the string now.
      source.append(in, first - in);

      // Lookup the definition of VAR.
      std::string var(first + 1, last - first - 2);
      if (const char* val = this->GetDefinition(var)) {
        // Store the value in the output escaping as requested.
        if (escapeQuotes) {
          source.append(cmSystemTools::EscapeQuotes(val));
        } else {
          source.append(val);
        }
      }

      // Continue looking for @VAR@ further along the string.
      in = last;
    }

    // Append the rest of the unchanged part of the string.
    source.append(in);

    return cmake::LOG;
  }

  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  cmCommandArgumentParserHelper parser;
  parser.SetMakefile(this);
  parser.SetLineFile(line, filename);
  parser.SetEscapeQuotes(escapeQuotes);
  parser.SetNoEscapeMode(noEscapes);
  parser.SetReplaceAtSyntax(replaceAt);
  parser.SetRemoveEmpty(removeEmpty);
  int res = parser.ParseString(source.c_str(), 0);
  const char* emsg = parser.GetError();
  cmake::MessageType mtype = cmake::LOG;
  if (res && !emsg[0]) {
    source = parser.GetResult();
  } else {
    // Construct the main error message.
    std::ostringstream error;
    error << "Syntax error in cmake code ";
    if (filename && line > 0) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      error << "at\n"
            << "  " << filename << ":" << line << "\n";
    }
    error << "when parsing string\n"
          << "  " << source << "\n";
    error << emsg;

    // If the parser failed ("res" is false) then this is a real
    // argument parsing error, so the policy applies.  Otherwise the
    // parser reported an error message without failing because the
    // helper implementation is unhappy, which has always reported an
    // error.
    mtype = cmake::FATAL_ERROR;
    if (!res) {
      // This is a real argument parsing error.  Use policy CMP0010 to
      // decide whether it is an error.
      switch (this->GetPolicyStatus(cmPolicies::CMP0010)) {
        case cmPolicies::WARN:
          error << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0010);
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          // OLD behavior is to just warn and continue.
          mtype = cmake::AUTHOR_WARNING;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          error << "\n"
                << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0010);
        case cmPolicies::NEW:
          // NEW behavior is to report the error.
          break;
      }
    }
    errorstr = error.str();
  }
  return mtype;
}